

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void CompressTables(lemon *lemp)

{
  state *psVar1;
  state *psVar2;
  bool bVar3;
  symbol *psVar4;
  action *paVar5;
  int local_4c;
  int usesWildcard;
  int i;
  int n;
  int nbest;
  rule *rbest;
  rule *rp2;
  rule *rp;
  action *ap2;
  action *ap;
  state *stp;
  lemon *lemp_local;
  
  local_4c = 0;
  do {
    if (lemp->nstate <= local_4c) {
      return;
    }
    psVar1 = lemp->sorted[local_4c];
    i = 0;
    _n = (state *)0x0;
    bVar3 = false;
    for (ap2 = psVar1->ap; ap2 != (action *)0x0; ap2 = ap2->next) {
      if ((ap2->type == SHIFT) && (ap2->sp == lemp->wildcard)) {
        bVar3 = true;
      }
      if (((ap2->type == REDUCE) && (psVar2 = (ap2->x).stp, psVar2->statenum == 0)) &&
         (psVar2 != _n)) {
        usesWildcard = 1;
        for (rp = (rule *)ap2->next; rp != (rule *)0x0; rp = *(rule **)&rp->nrhs) {
          if (((*(int *)&rp->lhsalias == 2) && (*(state **)&rp->lhsStart != _n)) &&
             (*(state **)&rp->lhsStart == psVar2)) {
            usesWildcard = usesWildcard + 1;
          }
        }
        if (i < usesWildcard) {
          i = usesWildcard;
          _n = psVar2;
        }
      }
    }
    if ((0 < i) && (!bVar3)) {
      for (ap2 = psVar1->ap;
          (ap2 != (action *)0x0 && ((ap2->type != REDUCE || ((ap2->x).stp != _n)))); ap2 = ap2->next
          ) {
      }
      if (ap2 == (action *)0x0) {
        __assert_fail("ap",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/misc/lemon.c"
                      ,0x1057,"void CompressTables(struct lemon *)");
      }
      psVar4 = Symbol_new("{default}");
      ap2->sp = psVar4;
      for (ap2 = ap2->next; ap2 != (action *)0x0; ap2 = ap2->next) {
        if ((ap2->type == REDUCE) && ((ap2->x).stp == _n)) {
          ap2->type = NOT_USED;
        }
      }
      paVar5 = Action_sort(psVar1->ap);
      psVar1->ap = paVar5;
    }
    local_4c = local_4c + 1;
  } while( true );
}

Assistant:

void CompressTables(struct lemon *lemp)
{
  struct state *stp;
  struct action *ap, *ap2;
  struct rule *rp, *rp2, *rbest;
  int nbest, n;
  int i;
  int usesWildcard;

  for(i=0; i<lemp->nstate; i++){
    stp = lemp->sorted[i];
    nbest = 0;
    rbest = 0;
    usesWildcard = 0;

    for(ap=stp->ap; ap; ap=ap->next){
      if( ap->type==SHIFT && ap->sp==lemp->wildcard ){
        usesWildcard = 1;
      }
      if( ap->type!=REDUCE ) continue;
      rp = ap->x.rp;
      if( rp->lhsStart ) continue;
      if( rp==rbest ) continue;
      n = 1;
      for(ap2=ap->next; ap2; ap2=ap2->next){
        if( ap2->type!=REDUCE ) continue;
        rp2 = ap2->x.rp;
        if( rp2==rbest ) continue;
        if( rp2==rp ) n++;
      }
      if( n>nbest ){
        nbest = n;
        rbest = rp;
      }
    }
 
    /* Do not make a default if the number of rules to default
    ** is not at least 1 or if the wildcard token is a possible
    ** lookahead.
    */
    if( nbest<1 || usesWildcard ) continue;


    /* Combine matching REDUCE actions into a single default */
    for(ap=stp->ap; ap; ap=ap->next){
      if( ap->type==REDUCE && ap->x.rp==rbest ) break;
    }
    assert( ap );
    ap->sp = Symbol_new("{default}");
    for(ap=ap->next; ap; ap=ap->next){
      if( ap->type==REDUCE && ap->x.rp==rbest ) ap->type = NOT_USED;
    }
    stp->ap = Action_sort(stp->ap);
  }
}